

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

string * __thiscall
NewSymbolTreeVisitor::UserTypeResolving_abi_cxx11_
          (string *__return_storage_ptr__,NewSymbolTreeVisitor *this,Symbol *symbol)

{
  runtime_error *this_00;
  mapped_type *pmVar1;
  bool local_59;
  _Node_iterator_base<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_30;
  NewScopeLayer *local_28;
  NewScopeLayer *local_current;
  Symbol *symbol_local;
  NewSymbolTreeVisitor *this_local;
  
  local_28 = this->current_layer_;
  local_current = (NewScopeLayer *)symbol;
  symbol_local = (Symbol *)this;
  this_local = (NewSymbolTreeVisitor *)__return_storage_ptr__;
  while( true ) {
    local_59 = false;
    if (local_28->parent_ != (NewScopeLayer *)0x0) {
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_28->user_type_system_,(key_type *)local_current);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&local_28->user_type_system_);
      local_59 = std::__detail::operator==(&local_30,&local_38);
    }
    if (local_59 == false) break;
    local_28 = local_28->parent_;
  }
  if (local_28->parent_ == (NewScopeLayer *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid method invocation from non user type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar1 = std::
           unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_28->user_type_system_,(key_type *)local_current);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string NewSymbolTreeVisitor::UserTypeResolving(const Symbol& symbol) {
  NewScopeLayer* local_current = current_layer_;

  while (local_current->parent_ != nullptr &&
         local_current->user_type_system_.find(symbol) ==
             local_current->user_type_system_.end()) {
    local_current = local_current->parent_;
  }

  if (local_current->parent_ == nullptr) {
    throw std::runtime_error("Invalid method invocation from non user type");
  }

  return local_current->user_type_system_[symbol];
}